

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector_senswrapper.c
# Opt level: O2

int N_VConstrMask_SensWrapper(N_Vector c,N_Vector x,N_Vector m)

{
  int iVar1;
  int test;
  int iVar2;
  int i;
  long lVar3;
  
  iVar2 = 1;
  for (lVar3 = 0; lVar3 < (int)*(long *)((long)x->content + 8); lVar3 = lVar3 + 1) {
    iVar1 = N_VConstrMask(c,*(N_Vector *)(*x->content + lVar3 * 8),
                          *(N_Vector *)(*m->content + lVar3 * 8));
    if (iVar1 != 1) {
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

booleantype N_VConstrMask_SensWrapper(N_Vector c, N_Vector x, N_Vector m)
{
  int i;
  booleantype test, tmp;

  test = SUNTRUE;

  for (i=0; i < NV_NVECS_SW(x); i++) {
    tmp = N_VConstrMask(c, NV_VEC_SW(x,i), NV_VEC_SW(m,i));
    if (tmp != SUNTRUE) test = SUNFALSE;
  }

  return(test);
}